

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::ElementUnsigned1
          (ByteCodeWriter *this,OpCode op,RegSlot Value,RegSlot Instance,uint32 Element)

{
  code *pcVar1;
  bool bVar2;
  RegSlot Value_00;
  RegSlot RVar3;
  undefined4 *puVar4;
  uint32 local_40;
  RegSlot local_3c;
  RegSlot local_38;
  RegSlot local_34;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x31);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  local_34 = Instance;
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x5a1,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_0089ee4d;
    *puVar4 = 0;
  }
  if (Value != 0xffffffff) {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_0089ee4d;
      *puVar4 = 0;
    }
    RVar3 = local_34;
    Value_00 = FunctionBody::MapRegSlot(this->m_functionWrite,Value);
    if (RVar3 != 0xffffffff) {
      if (this->m_functionWrite != (FunctionBody *)0x0) {
LAB_0089ed73:
        RVar3 = FunctionBody::MapRegSlot(this->m_functionWrite,RVar3);
        bVar2 = TryWriteElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,op,Value_00,RVar3,Element);
        if (!bVar2) {
          bVar2 = TryWriteElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                            (this,op,Value_00,RVar3,Element);
          if (!bVar2) {
            local_40 = Element;
            local_3c = Value_00;
            local_38 = RVar3;
            Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op,this);
            Data::Write(&this->m_byteCodeData,&local_40,0xc);
          }
        }
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (bVar2) {
        *puVar4 = 0;
        RVar3 = local_34;
        goto LAB_0089ed73;
      }
      goto LAB_0089ee4d;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar4 = 0;
    Throw::InternalError();
  }
LAB_0089ee4d:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::ElementUnsigned1(OpCode op, RegSlot Value, RegSlot Instance, uint32 Element)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementUnsigned1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        Value = ConsumeReg(Value);
        Instance = ConsumeReg(Instance);

        MULTISIZE_LAYOUT_WRITE(ElementUnsigned1, op, Value, Instance, Element);
    }